

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 __thiscall djb::tab::cdfv(tab *this,vec2 *u,vec3 *wi)

{
  float_t fVar1;
  float_t fVar2;
  double dVar3;
  vec2 vVar4;
  float_t local_5c;
  float local_4c;
  float_t u4;
  float_t local_44;
  float_t u3;
  float_t u2;
  float_t u1;
  float_t pi;
  int res4;
  int res3;
  int res2;
  int res1;
  vec3 *wi_local;
  vec2 *u_local;
  tab *this_local;
  
  res3 = 0x200;
  res4 = 0x40;
  pi = 2.24208e-44;
  u1 = 4.48416e-44;
  _res2 = wi;
  wi_local = (vec3 *)u;
  u_local = (vec2 *)this;
  if (1.0 < wi->z || wi->z == 1.0) {
    local_5c = 0.0;
  }
  else {
    dVar3 = std::atan2((double)(ulong)(uint)wi->y,(double)(ulong)(uint)wi->x);
    local_5c = SUB84(dVar3,0);
  }
  u2 = local_5c;
  u3 = wi_local->x;
  local_44 = wi_local->y;
  dVar3 = std::acos((double)(ulong)(uint)_res2->z);
  fVar1 = m_pi();
  local_4c = SUB84(dVar3,0) * (2.0 / fVar1);
  u4 = sqr<float>(&local_4c);
  fVar1 = u2;
  fVar2 = m_pi();
  vVar4 = spline::eval4d<djb::vec2>
                    (&this->m_cdf,res3,res4,(int)pi,(int)u1,spline::uwrap_edge,u3,spline::uwrap_edge
                     ,local_44,spline::uwrap_edge,u4,spline::uwrap_repeat,
                     (fVar1 / fVar2 + 1.0) * 0.5);
  return vVar4;
}

Assistant:

vec2 tab::cdfv(const vec2 &u, const vec3 &wi) const
{
	int res1 = 512;
	int res2 = 64;
	int res3 = 16;
	int res4 = 32;
	float_t pi = wi.z < 1 ? atan2(wi.y, wi.x) : 0;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(wi.z) * (2 / m_pi()));
	float_t u4 = (pi / m_pi() + 1) / 2;

	return spline::eval4d(m_cdf,
	                      res1, res2, res3, res4,
	                      spline::uwrap_edge  , u1,
	                      spline::uwrap_edge  , u2,
	                      spline::uwrap_edge  , u3,
	                      spline::uwrap_repeat, u4);
}